

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

bool __thiscall
rlottie::internal::renderer::GradientStroke::updateContent
          (GradientStroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  Drawable *this_00;
  vector<float,_std::allocator<float>_> *result;
  CapStyle cap;
  JoinStyle join;
  VGradient *pVVar1;
  VPointF VVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  long lVar7;
  float *elm;
  pointer pfVar8;
  pointer pfVar9;
  VMatrix *this_01;
  GradientStroke *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 local_40 [8];
  anon_union_8_3_adf75f03_for_VBrush_2 aStack_38;
  VPointF local_30;
  
  pGVar10 = this->mData;
  if ((pGVar10->super_Gradient).mOpacity.isValue_ == true) {
    fVar12 = (pGVar10->super_Gradient).mOpacity.impl_.value_;
  }
  else {
    fVar12 = model::KeyFrames<float,_void>::value((pGVar10->super_Gradient).mOpacity.impl_,frameNo);
    pGVar10 = this->mData;
  }
  fVar11 = (fVar12 / 100.0) * alpha;
  model::Gradient::update(&pGVar10->super_Gradient,&this->mGradient,frameNo);
  pVVar1 = (this->mGradient)._M_t.super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>.
           _M_t.super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
           super__Head_base<0UL,_VGradient_*,_false>._M_head_impl;
  pVVar1->mAlpha = fVar11;
  fVar12 = matrix->m12;
  fVar14 = matrix->m13;
  fVar13 = matrix->m21;
  fVar3 = matrix->m22;
  fVar4 = matrix->m23;
  fVar5 = matrix->mtx;
  fVar6 = matrix->mty;
  (pVVar1->mMatrix).m11 = matrix->m11;
  (pVVar1->mMatrix).m12 = fVar12;
  (pVVar1->mMatrix).m13 = fVar14;
  (pVVar1->mMatrix).m21 = fVar13;
  (pVVar1->mMatrix).m22 = fVar3;
  (pVVar1->mMatrix).m23 = fVar4;
  (pVVar1->mMatrix).mtx = fVar5;
  (pVVar1->mMatrix).mty = fVar6;
  *(undefined8 *)((long)&(pVVar1->mMatrix).mty + 2) = *(undefined8 *)((long)&matrix->mty + 2);
  this_01 = &((this->mGradient)._M_t.
              super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>._M_t.
              super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
              super__Head_base<0UL,_VGradient_*,_false>._M_head_impl)->mMatrix;
  local_40._0_4_ = 0.0;
  local_40._4_4_ = 0.0;
  local_30.mx = 1.41421;
  local_30.my = 1.41421;
  local_40 = (undefined1  [8])VMatrix::map(this_01,(VPointF *)local_40);
  VVar2 = VMatrix::map(this_01,&local_30);
  fVar14 = VVar2.mx - (float)local_40._0_4_;
  fVar12 = VVar2.my - (float)local_40._4_4_;
  fVar14 = SQRT(fVar14 * fVar14 + fVar12 * fVar12) * 0.5;
  this_00 = &(this->super_Paint).mDrawable;
  VBrush::VBrush((VBrush *)local_40,
                 (this->mGradient)._M_t.
                 super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>._M_t.
                 super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
                 super__Head_base<0UL,_VGradient_*,_false>._M_head_impl);
  *(undefined1 (*) [8])&(this->super_Paint).mDrawable.super_VDrawable.mBrush = local_40;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.field_1 = aStack_38;
  pGVar10 = this->mData;
  cap = pGVar10->mCapStyle;
  join = pGVar10->mJoinStyle;
  fVar12 = pGVar10->mMiterLimit;
  if ((pGVar10->mWidth).isValue_ == true) {
    fVar13 = (pGVar10->mWidth).impl_.value_;
  }
  else {
    fVar13 = model::KeyFrames<float,_void>::value((pGVar10->mWidth).impl_,frameNo);
  }
  VDrawable::setStrokeInfo(&this_00->super_VDrawable,cap,join,fVar12,fVar13 * fVar14);
  if ((this->mData->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mData->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar7 = __tls_get_addr(&PTR_00144f70);
    if (*(char *)(lVar7 + 0x58) == '\0') {
      updateContent();
    }
    result = (vector<float,_std::allocator<float>_> *)(lVar7 + 0x40);
    pfVar8 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(pointer *)(lVar7 + 0x48) != pfVar8) {
      *(pointer *)(lVar7 + 0x48) = pfVar8;
    }
    pGVar10 = this->mData;
    if (*(char *)(lVar7 + 0x58) == '\0') {
      updateContent();
    }
    model::Dash::getDashInfo(&pGVar10->mDash,frameNo,result);
    if (*(char *)(lVar7 + 0x58) == '\0') {
      updateContent();
    }
    pfVar8 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar9 = *(pointer *)(lVar7 + 0x48);
    if (pfVar8 != pfVar9) {
      if (*(char *)(lVar7 + 0x58) == '\0') {
        *(undefined1 *)(lVar7 + 0x58) = 1;
        *(undefined8 *)(lVar7 + 0x40) = 0;
        *(undefined8 *)(lVar7 + 0x48) = 0;
        *(undefined8 *)(lVar7 + 0x50) = 0;
        __cxa_thread_atexit(std::vector<float,_std::allocator<float>_>::~vector,
                            (undefined8 *)(lVar7 + 0x40),&__dso_handle);
        pfVar8 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar9 = *(pointer *)(lVar7 + 0x48);
      }
      for (; pfVar8 != pfVar9; pfVar8 = pfVar8 + 1) {
        *pfVar8 = *pfVar8 * fVar14;
      }
      if (*(char *)(lVar7 + 0x58) == '\0') {
        updateContent();
      }
      VDrawable::setDashInfo(&this_00->super_VDrawable,result);
    }
  }
  return 1e-06 < ABS(fVar11);
}

Assistant:

bool renderer::GradientStroke::updateContent(int frameNo, const VMatrix &matrix,
                                             float alpha)
{
    float combinedAlpha = alpha * mData->opacity(frameNo);

    mData->update(mGradient, frameNo);
    mGradient->setAlpha(combinedAlpha);
    mGradient->mMatrix = matrix;
    auto scale = mGradient->mMatrix.scale();
    mDrawable.setBrush(VBrush(mGradient.get()));
    mDrawable.setStrokeInfo(mData->capStyle(), mData->joinStyle(),
                            mData->miterLimit(), mData->width(frameNo) * scale);

    if (mData->hasDashInfo()) {
        Dash_Vector.clear();
        mData->getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !vIsZero(combinedAlpha);
}